

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_resetCStream(ZSTD_CStream *zcs,unsigned_long_long pledgedSrcSize)

{
  ZSTD_CDict *cdict;
  uint uVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  ZSTD_CCtx_params *pZVar5;
  ZSTD_CCtx_params *pZVar6;
  undefined8 *puVar7;
  ulong srcSizeHint;
  byte bVar8;
  ZSTD_CCtx_params in_stack_fffffffffffffea8;
  ZSTD_compressionParameters local_c4;
  ZSTD_CCtx_params params;
  
  bVar8 = 0;
  lVar4 = 0xf;
  pZVar5 = &zcs->requestedParams;
  pZVar6 = &params;
  for (lVar3 = lVar4; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = (pZVar5->cParams).windowLog;
    pZVar6->format = pZVar5->format;
    (pZVar6->cParams).windowLog = uVar1;
    pZVar5 = (ZSTD_CCtx_params *)&(pZVar5->cParams).chainLog;
    pZVar6 = (ZSTD_CCtx_params *)&(pZVar6->cParams).chainLog;
  }
  srcSizeHint = -(ulong)(pledgedSrcSize == 0) | pledgedSrcSize;
  params.fParams.contentSizeFlag = 1;
  ZSTD_getCParamsFromCCtxParams(&local_c4,&params,srcSizeHint,0);
  params.cParams.targetLength = local_c4.targetLength;
  params.cParams.strategy = local_c4.strategy;
  params.cParams.windowLog = local_c4.windowLog;
  params.cParams.chainLog = local_c4.chainLog;
  cdict = zcs->cdict;
  pZVar5 = &params;
  puVar7 = (undefined8 *)&stack0xfffffffffffffea8;
  for (; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar7 = *(undefined8 *)pZVar5;
    pZVar5 = (ZSTD_CCtx_params *)((long)pZVar5 + (ulong)bVar8 * -0x10 + 8);
    puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
  }
  sVar2 = ZSTD_compressBegin_internal
                    (zcs,(void *)0x0,0,ZSTD_dct_auto,ZSTD_dtlm_fast,cdict,in_stack_fffffffffffffea8,
                     srcSizeHint,ZSTDb_buffered);
  if (sVar2 < 0xffffffffffffff89) {
    zcs->inToCompress = 0;
    zcs->inBuffPos = 0;
    zcs->inBuffTarget = (ulong)(zcs->blockSize == srcSizeHint) + zcs->blockSize;
    zcs->outBuffContentSize = 0;
    zcs->outBuffFlushedSize = 0;
    zcs->streamStage = zcss_load;
    zcs->frameEnded = 0;
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

size_t ZSTD_resetCStream(ZSTD_CStream* zcs, unsigned long long pledgedSrcSize)
{
    ZSTD_CCtx_params params = zcs->requestedParams;
    DEBUGLOG(4, "ZSTD_resetCStream: pledgedSrcSize = %u", (U32)pledgedSrcSize);
    if (pledgedSrcSize==0) pledgedSrcSize = ZSTD_CONTENTSIZE_UNKNOWN;
    params.fParams.contentSizeFlag = 1;
    params.cParams = ZSTD_getCParamsFromCCtxParams(&params, pledgedSrcSize, 0);
    return ZSTD_resetCStream_internal(zcs, NULL, 0, ZSTD_dct_auto, zcs->cdict, params, pledgedSrcSize);
}